

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O0

MPP_RET activate_sps(H264dVideoCtx_t *p_Vid,H264_SPS_t *sps,H264_subSPS_t *subset_sps)

{
  RK_U32 RVar1;
  RK_U32 local_30;
  MPP_RET local_2c;
  MPP_RET ret;
  H264_subSPS_t *subset_sps_local;
  H264_SPS_t *sps_local;
  H264dVideoCtx_t *p_Vid_local;
  
  if (((p_Vid == (H264dVideoCtx_t *)0x0) && (sps == (H264_SPS_t *)0x0)) &&
     (subset_sps == (H264_subSPS_t *)0x0)) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_sps","input empty(%d).\n",(char *)0x0,0x245);
    }
LAB_001c0e21:
    p_Vid_local._4_4_ = MPP_OK;
  }
  else {
    if ((p_Vid->dec_pic == (h264_store_pic_t *)0x0) ||
       (local_2c = exit_picture(p_Vid,&p_Vid->dec_pic), MPP_NOK < local_2c)) {
      if (p_Vid->active_mvc_sps_flag == 0) {
        p_Vid->active_sps = sps;
        p_Vid->active_subsps = (h264_subsps_t *)0x0;
        p_Vid->active_sps_id[0] = sps->seq_parameter_set_id;
        p_Vid->active_sps_id[1] = 0;
        RVar1 = video_pars_changed(p_Vid,p_Vid->active_sps,'\0');
        if (RVar1 == 0) {
LAB_001c0d64:
          if (p_Vid->dpb_size[0] != 0) goto LAB_001c0db7;
          local_2c = MPP_ERR_VALUE;
          if ((h264d_debug & 4) != 0) {
            _mpp_log_l(4,"h264d_sps","value error(%d).\n",(char *)0x0,0x26b);
          }
        }
        else if ((p_Vid->no_output_of_prior_pics_flag == 0) &&
                (local_2c = flush_dpb(p_Vid->p_Dpb_layer[0],1), local_2c < MPP_OK)) {
          if ((h264d_debug & 4) != 0) {
            _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,0x263);
          }
        }
        else {
          local_2c = init_dpb(p_Vid,p_Vid->p_Dpb_layer[0],1);
          if (MPP_NOK < local_2c) {
            update_last_video_pars(p_Vid,p_Vid->active_sps,'\0');
            p_Vid->dpb_size[0] = p_Vid->p_Dpb_layer[0]->size;
            p_Vid->spspps_update = 1;
            goto LAB_001c0d64;
          }
          if ((h264d_debug & 4) != 0) {
            _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,0x265);
          }
        }
      }
      else {
        p_Vid->active_sps = &subset_sps->sps;
        p_Vid->active_subsps = subset_sps;
        p_Vid->active_sps_id[0] = 0;
        p_Vid->active_sps_id[1] = (subset_sps->sps).seq_parameter_set_id;
        RVar1 = video_pars_changed(p_Vid,p_Vid->active_sps,'\x01');
        if (RVar1 == 0) {
LAB_001c0ba3:
          if (p_Vid->dpb_size[1] != 0) {
LAB_001c0db7:
            if ((h264d_debug & 0x100) != 0) {
              _mpp_log_l(4,"h264d_sps","[DPB_size] dpb_size[0]=%d, mvc_flag=%d, dpb_size[1]=%d",
                         (char *)0x0,(ulong)p_Vid->dpb_size[0],
                         (ulong)(uint)p_Vid->active_mvc_sps_flag,p_Vid->dpb_size[1]);
            }
            update_video_pars(p_Vid,p_Vid->active_sps);
            goto LAB_001c0e21;
          }
          local_2c = MPP_ERR_VALUE;
          if ((h264d_debug & 4) != 0) {
            _mpp_log_l(4,"h264d_sps","value error(%d).\n",(char *)0x0,0x25b);
          }
        }
        else {
          local_2c = flush_dpb(p_Vid->p_Dpb_layer[1],2);
          if (local_2c < MPP_OK) {
            if ((h264d_debug & 4) != 0) {
              _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,0x24f);
            }
          }
          else {
            local_2c = init_dpb(p_Vid,p_Vid->p_Dpb_layer[1],2);
            if (local_2c < MPP_OK) {
              if ((h264d_debug & 4) != 0) {
                _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,0x250);
              }
            }
            else {
              local_2c = check_mvc_dpb(p_Vid,p_Vid->p_Dpb_layer[0],p_Vid->p_Dpb_layer[1]);
              if (MPP_NOK < local_2c) {
                update_last_video_pars(p_Vid,p_Vid->active_sps,'\x01');
                p_Vid->dpb_size[1] = p_Vid->p_Dpb_layer[1]->size;
                p_Vid->spspps_update = 1;
                if ((p_Vid->p_Dec->mvc_valid != '\0') && (p_Vid->p_Dpb_layer[1]->size != 0)) {
                  if (p_Vid->p_Dpb_layer[1]->size < 9) {
                    local_30 = p_Vid->p_Dpb_layer[1]->size;
                  }
                  else {
                    local_30 = 8;
                  }
                  p_Vid->p_Dpb_layer[0]->size = local_30;
                  p_Vid->dpb_size[0] = p_Vid->p_Dpb_layer[0]->size;
                }
                goto LAB_001c0ba3;
              }
              if ((h264d_debug & 4) != 0) {
                _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,0x251);
              }
            }
          }
        }
      }
    }
    else if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,0x247);
    }
    p_Vid_local._4_4_ = local_2c;
  }
  return p_Vid_local._4_4_;
}

Assistant:

MPP_RET activate_sps(H264dVideoCtx_t *p_Vid, H264_SPS_t *sps, H264_subSPS_t *subset_sps)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    INP_CHECK(ret, !p_Vid && !sps && !subset_sps);
    if (p_Vid->dec_pic) {
        FUN_CHECK(ret = exit_picture(p_Vid, &p_Vid->dec_pic));
    }
    if (p_Vid->active_mvc_sps_flag) { // layer_id == 1
        p_Vid->active_sps = &subset_sps->sps;
        p_Vid->active_subsps = subset_sps;
        p_Vid->active_sps_id[0] = 0;
        p_Vid->active_sps_id[1] = subset_sps->sps.seq_parameter_set_id;
        if (video_pars_changed(p_Vid, p_Vid->active_sps, 1)) {
            FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[1], 2));
            FUN_CHECK(ret = init_dpb(p_Vid, p_Vid->p_Dpb_layer[1], 2));
            FUN_CHECK(ret = check_mvc_dpb(p_Vid, p_Vid->p_Dpb_layer[0], p_Vid->p_Dpb_layer[1]));
            update_last_video_pars(p_Vid, p_Vid->active_sps, 1);
            //!< init frame slots, store frame buffer size
            p_Vid->dpb_size[1] = p_Vid->p_Dpb_layer[1]->size;
            p_Vid->spspps_update = 1;
            if (p_Vid->p_Dec->mvc_valid && p_Vid->p_Dpb_layer[1]->size > 0) {
                p_Vid->p_Dpb_layer[0]->size = MPP_MIN(p_Vid->p_Dpb_layer[1]->size, MAX_DPB_SIZE / 2);
                p_Vid->dpb_size[0] = p_Vid->p_Dpb_layer[0]->size;
            }
        }
        VAL_CHECK(ret, p_Vid->dpb_size[1] > 0);
    } else { //!< layer_id == 0
        p_Vid->active_sps = sps;
        p_Vid->active_subsps = NULL;
        p_Vid->active_sps_id[0] = sps->seq_parameter_set_id;
        p_Vid->active_sps_id[1] = 0;
        if (video_pars_changed(p_Vid, p_Vid->active_sps, 0)) {
            if (!p_Vid->no_output_of_prior_pics_flag) {
                FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[0], 1));
            }
            FUN_CHECK(ret = init_dpb(p_Vid, p_Vid->p_Dpb_layer[0], 1));
            update_last_video_pars(p_Vid, p_Vid->active_sps, 0);
            //!< init frame slots, store frame buffer size
            p_Vid->dpb_size[0] = p_Vid->p_Dpb_layer[0]->size;
            p_Vid->spspps_update = 1;
        }
        VAL_CHECK(ret, p_Vid->dpb_size[0] > 0);
    }
    H264D_DBG(H264D_DBG_DPB_INFO, "[DPB_size] dpb_size[0]=%d, mvc_flag=%d, dpb_size[1]=%d",
              p_Vid->dpb_size[0], p_Vid->active_mvc_sps_flag, p_Vid->dpb_size[1]);
    update_video_pars(p_Vid, p_Vid->active_sps);
__RETURN:
    return ret = MPP_OK;
__FAILED:
    return ret;
}